

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ParseHTMLWithNode(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *local_68;
  TidyParserMemory local_60;
  int local_2c;
  Parser *pPStack_28;
  Bool something_to_do;
  Parser *parser;
  Node *pNStack_18;
  GetTokenMode mode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  parser._4_4_ = IgnoreWhitespace;
  pNStack_18 = node;
  node_local = &doc->root;
  pPStack_28 = GetParserForNode(doc,node);
  local_2c = 1;
LAB_0013deaf:
  while( true ) {
    if (local_2c == 0) {
      return;
    }
    if (pPStack_28 == (Parser *)0x0) {
      local_68 = (Node *)0x0;
    }
    else {
      local_68 = (*pPStack_28)((TidyDocImpl *)node_local,pNStack_18,parser._4_4_);
    }
    pNStack_18 = local_68;
    if (local_68 == (Node *)0x0) break;
    pPStack_28 = GetParserForNode((TidyDocImpl *)node_local,local_68);
  }
  BVar1 = prvTidyisEmptyParserStack((TidyDocImpl *)node_local);
  if (BVar1 == no) goto code_r0x0013df0f;
  goto LAB_0013df40;
code_r0x0013df0f:
  pPStack_28 = prvTidypeekMemoryIdentity((TidyDocImpl *)node_local);
  if (pPStack_28 == (Parser *)0x0) {
    parser._4_4_ = prvTidypeekMemoryMode((TidyDocImpl *)node_local);
    prvTidypopMemory(&local_60,(TidyDocImpl *)node_local);
LAB_0013df40:
    pNStack_18 = prvTidyGetToken((TidyDocImpl *)node_local,parser._4_4_);
    if (pNStack_18 == (Node *)0x0) {
      local_2c = 0;
    }
    else {
      pPStack_28 = GetParserForNode((TidyDocImpl *)node_local,pNStack_18);
    }
  }
  goto LAB_0013deaf;
}

Assistant:

void ParseHTMLWithNode( TidyDocImpl* doc, Node* node )
{
    GetTokenMode mode = IgnoreWhitespace;
    Parser* parser = GetParserForNode( doc, node );
    Bool something_to_do = yes;

    /*
     This main loop is only extinguished when all of the parser tokens are
     consumed. Ideally, EVERY parser will return nodes to this loop for
     dispatch to the appropriate parser, but some of the recursive parsers
     still consume some tokens on their own.
     */
    while (something_to_do)
    {
        node = parser ? parser( doc, node, mode ) : NULL;
        
        /*
         We have a node, so anything deferred was already pushed to the stack
         to be dealt with later.
         */
        if ( node )
        {
            parser = GetParserForNode( doc, node );
            continue;
        }

        /*
         We weren't given a node, which means this particular leaf is bottomed
         out. We'll re-enter the parsers using information from the stack.
         */
        if ( !TY_(isEmptyParserStack)(doc))
        {
            parser = TY_(peekMemoryIdentity)(doc);
            if (parser)
            {
                continue;
            }
            else
            {
                /* No parser means we're only passing back a parsing mode. */
                mode = TY_(peekMemoryMode)( doc );
                TY_(popMemory)( doc );
            }
        }
        
        /*
         At this point, there's nothing being returned from parsers, and
         nothing on the stack, so we can draw a new node from the lexer.
         */
        node = TY_(GetToken)( doc, mode );
        DEBUG_LOG_GOT_TOKEN(node);

        if (node)
            parser = GetParserForNode( doc, node );
        else
            something_to_do = no;
    }
}